

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O0

void prometheus::(anonymous_namespace)::WriteHead<std::__cxx11::string>
               (ostream *out,MetricFamily *family,ClientMetric *metric,string *suffix,
               string *extraLabelName,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraLabelValue)

{
  bool bVar1;
  ostream *poVar2;
  reference pLVar3;
  ulong uVar4;
  Label *lp;
  const_iterator __end3;
  const_iterator __begin3;
  vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  *__range3;
  char *prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraLabelValue_local;
  string *extraLabelName_local;
  string *suffix_local;
  ClientMetric *metric_local;
  MetricFamily *family_local;
  ostream *out_local;
  
  poVar2 = ::std::operator<<(out,(string *)family);
  ::std::operator<<(poVar2,(string *)suffix);
  bVar1 = ::std::
          vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
          ::empty(&metric->label);
  if ((!bVar1) || (uVar4 = ::std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    ::std::operator<<(out,"{");
    __range3 = (vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                *)0x153c9c;
    __end3 = ::std::
             vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
             ::begin(&metric->label);
    lp = (Label *)::std::
                  vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                  ::end(&metric->label);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
                                       *)&lp), bVar1) {
      pLVar3 = __gnu_cxx::
               __normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
               ::operator*(&__end3);
      poVar2 = ::std::operator<<(out,(char *)__range3);
      poVar2 = ::std::operator<<(poVar2,(string *)pLVar3);
      ::std::operator<<(poVar2,"=\"");
      anon_unknown_5::WriteValue(out,&pLVar3->value);
      ::std::operator<<(out,"\"");
      __range3 = (vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                  *)anon_var_dwarf_a0870;
      __gnu_cxx::
      __normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
      ::operator++(&__end3);
    }
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      poVar2 = ::std::operator<<(out,(char *)__range3);
      poVar2 = ::std::operator<<(poVar2,(string *)extraLabelName);
      ::std::operator<<(poVar2,"=\"");
      anon_unknown_5::WriteValue(out,extraLabelValue);
      ::std::operator<<(out,"\"");
    }
    ::std::operator<<(out,"}");
  }
  ::std::operator<<(out," ");
  return;
}

Assistant:

void WriteHead(std::ostream& out, const MetricFamily& family,
               const ClientMetric& metric, const std::string& suffix = "",
               const std::string& extraLabelName = "",
               const T& extraLabelValue = T()) {
  out << family.name << suffix;
  if (!metric.label.empty() || !extraLabelName.empty()) {
    out << "{";
    const char* prefix = "";

    for (auto& lp : metric.label) {
      out << prefix << lp.name << "=\"";
      WriteValue(out, lp.value);
      out << "\"";
      prefix = ",";
    }
    if (!extraLabelName.empty()) {
      out << prefix << extraLabelName << "=\"";
      WriteValue(out, extraLabelValue);
      out << "\"";
    }
    out << "}";
  }
  out << " ";
}